

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.cpp
# Opt level: O2

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::case0012(TypeCanonicalizerAndResolverTester *this)

{
  Decl *pDVar1;
  Ty *pTVar2;
  Expectation *pEVar3;
  allocator<char> local_34a;
  allocator<char> local_349;
  string local_348;
  string local_328;
  Expectation local_308;
  Expectation local_250;
  Decl local_198;
  Decl local_d0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"\ntypedef double x ;\nx y ( int w , x z ) ;\n",&local_349);
  Expectation::Expectation(&local_308);
  Decl::Decl(&local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"y",&local_34a);
  pDVar1 = Decl::Function(&local_198,&local_348,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Double,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  pDVar1 = Ty::Basic(pTVar2,Int_S,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  pDVar1 = Ty::Basic(pTVar2,Double,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  Decl::Decl(&local_d0,pDVar1);
  pEVar3 = Expectation::declaration(&local_308,&local_d0);
  Expectation::Expectation(&local_250,pEVar3);
  canonicalizerAndResolveTypes(this,&local_328,&local_250);
  Expectation::~Expectation(&local_250);
  Decl::~Decl(&local_d0);
  std::__cxx11::string::~string((string *)&local_348);
  Decl::~Decl(&local_198);
  Expectation::~Expectation(&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  return;
}

Assistant:

void TypeCanonicalizerAndResolverTester::case0012()
{
    auto s = R"(
typedef double x ;
x y ( int w , x z ) ;
)";

    canonicalizerAndResolveTypes(s,
            Expectation()
            .declaration(Decl()
                         .Function("y")
                         .ty_.Basic(BasicTypeKind::Double)
                         .ty_.addParam().Basic(BasicTypeKind::Int_S)
                         .ty_.addParam().Basic(BasicTypeKind::Double)
                         .ty_.Derived(TypeKind::Function)));
}